

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O0

int __thiscall stk::FileRead::open(FileRead *this,char *__file,int __oflag,...)

{
  int iVar1;
  int extraout_EAX;
  char *pcVar2;
  FILE *pFVar3;
  ostream *poVar4;
  size_t sVar5;
  FileRead *extraout_RAX;
  uint in_ECX;
  StkFormat in_R8;
  StkFloat in_XMM0_Qa;
  char local_3d [8];
  char header [12];
  bool result;
  StkFloat rate_local;
  StkFormat format_local;
  uint nChannels_local;
  bool typeRaw_local;
  string *fileName_local;
  FileRead *this_local;
  
  unique0x10000477 = in_XMM0_Qa;
  close(this,(int)__file);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"rb");
  this->fd_ = (FILE *)pFVar3;
  if (this->fd_ == (FILE *)0x0) {
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileRead::open: could not open or find file (");
    poVar4 = std::operator<<(poVar4,(string *)__file);
    std::operator<<(poVar4,")!");
    Stk::handleError(&this->super_Stk,FILE_NOT_FOUND);
  }
  header[4] = '\0';
  if ((__oflag & 1U) == 0) {
    sVar5 = fread(local_3d,4,3,(FILE *)this->fd_);
    if (sVar5 != 3) {
LAB_00116206:
      poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                               "FileRead::open: error reading file (");
      poVar4 = std::operator<<(poVar4,(string *)__file);
      std::operator<<(poVar4,")!");
      Stk::handleError(&this->super_Stk,FILE_ERROR);
      return extraout_EAX;
    }
    iVar1 = strncmp(local_3d,"RIFF",4);
    if ((iVar1 == 0) && (iVar1 = strncmp(header,"WAVE",4), iVar1 == 0)) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      header[4] = getWavInfo(this,pcVar2);
    }
    else {
      iVar1 = strncmp(local_3d,".snd",4);
      if (iVar1 == 0) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        header[4] = getSndInfo(this,pcVar2);
      }
      else {
        iVar1 = strncmp(local_3d,"FORM",4);
        if ((iVar1 == 0) &&
           ((iVar1 = strncmp(header,"AIFF",4), iVar1 == 0 ||
            (iVar1 = strncmp(header,"AIFC",4), iVar1 == 0)))) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          header[4] = getAifInfo(this,pcVar2);
        }
        else {
          iVar1 = fseek((FILE *)this->fd_,0x7e,0);
          if ((iVar1 == -1) || (sVar5 = fread(local_3d,2,1,(FILE *)this->fd_), sVar5 != 1))
          goto LAB_00116206;
          iVar1 = strncmp(local_3d,"MI",2);
          if ((iVar1 == 0) || (iVar1 = strncmp(local_3d,"IM",2), iVar1 == 0)) {
            pcVar2 = (char *)std::__cxx11::string::c_str();
            header[4] = getMatInfo(this,pcVar2);
          }
          else {
            poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead::open: file (");
            poVar4 = std::operator<<(poVar4,(string *)__file);
            std::operator<<(poVar4,") format unknown.");
            Stk::handleError(&this->super_Stk,FILE_UNKNOWN_FORMAT);
          }
        }
      }
    }
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    header[4] = getRawInfo(this,pcVar2,in_ECX,in_R8,stack0xffffffffffffffd0);
  }
  if ((header[4] & 1U) == 0) {
    Stk::handleError(&this->super_Stk,FILE_ERROR);
  }
  if (this->fileSize_ == 0) {
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead::open: file (");
    poVar4 = std::operator<<(poVar4,(string *)__file);
    std::operator<<(poVar4,") data size is zero!");
    Stk::handleError(&this->super_Stk,FILE_ERROR);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void FileRead :: open( std::string fileName, bool typeRaw, unsigned int nChannels,
                       StkFormat format, StkFloat rate )
{
  // If another file is open, close it.
  close();

  // Try to open the file.
  fd_ = fopen( fileName.c_str(), "rb" );
  if ( !fd_ ) {
    oStream_ << "FileRead::open: could not open or find file (" << fileName << ")!";
    handleError( StkError::FILE_NOT_FOUND );
  }

  // Attempt to determine file type from header (unless RAW).
  bool result = false;
  if ( typeRaw )
    result = getRawInfo( fileName.c_str(), nChannels, format, rate );
  else {
    char header[12];
    if ( fread( &header, 4, 3, fd_ ) != 3 ) goto error;
    if ( !strncmp( header, "RIFF", 4 ) &&
         !strncmp( &header[8], "WAVE", 4 ) )
      result = getWavInfo( fileName.c_str() );
    else if ( !strncmp( header, ".snd", 4 ) )
      result = getSndInfo( fileName.c_str() );
    else if ( !strncmp( header, "FORM", 4 ) &&
              ( !strncmp( &header[8], "AIFF", 4 ) || !strncmp(&header[8], "AIFC", 4) ) )
      result = getAifInfo( fileName.c_str() );
    else {
      if ( fseek( fd_, 126, SEEK_SET ) == -1 ) goto error;
      if ( fread( &header, 2, 1, fd_ ) != 1 ) goto error;
      if ( !strncmp( header, "MI", 2 ) ||
           !strncmp( header, "IM", 2 ) )
        result = getMatInfo( fileName.c_str() );
      else {
        oStream_ << "FileRead::open: file (" << fileName << ") format unknown.";
        handleError( StkError::FILE_UNKNOWN_FORMAT );
      }
    }
  }

  // If here, we had a file type candidate but something else went wrong.
  if ( result == false )
    handleError( StkError::FILE_ERROR );

  // Check for empty files.
  if ( fileSize_ == 0 ) {
    oStream_ << "FileRead::open: file (" << fileName << ") data size is zero!";
    handleError( StkError::FILE_ERROR );
  }

  return;

 error:
  oStream_ << "FileRead::open: error reading file (" << fileName << ")!";
  handleError( StkError::FILE_ERROR );
}